

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O0

void __thiscall cmCTestP4::DescribeParser::DoHeaderLine(DescribeParser *this)

{
  string *__return_storage_ptr__;
  cmCTestP4 *this_00;
  bool bVar1;
  RegularExpression *this_01;
  string local_f0;
  undefined1 local_d0 [8];
  User user;
  string local_30;
  DescribeParser *local_10;
  DescribeParser *this_local;
  
  local_10 = this;
  bVar1 = cmsys::RegularExpression::find(&this->RegexHeader,&(this->super_LineParser).Line);
  if (bVar1) {
    this_01 = &this->RegexHeader;
    cmsys::RegularExpression::match_abi_cxx11_(&local_30,this_01,1);
    std::__cxx11::string::operator=((string *)&this->Rev,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    __return_storage_ptr__ = (string *)(user.AccessTime.field_2._M_local_buf + 8);
    cmsys::RegularExpression::match_abi_cxx11_(__return_storage_ptr__,this_01,4);
    std::__cxx11::string::operator=((string *)&(this->Rev).Date,(string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
    this_00 = this->P4;
    cmsys::RegularExpression::match_abi_cxx11_(&local_f0,this_01,2);
    GetUserData((User *)local_d0,this_00,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::operator=
              ((string *)&(this->Rev).Author,(string *)(user.UserName.field_2._M_local_buf + 8));
    std::__cxx11::string::operator=
              ((string *)&(this->Rev).EMail,(string *)(user.Name.field_2._M_local_buf + 8));
    std::__cxx11::string::operator=((string *)&(this->Rev).Committer,(string *)&(this->Rev).Author);
    std::__cxx11::string::operator=
              ((string *)&(this->Rev).CommitterEMail,(string *)&(this->Rev).EMail);
    std::__cxx11::string::operator=((string *)&(this->Rev).CommitDate,(string *)&(this->Rev).Date);
    User::~User((User *)local_d0);
  }
  return;
}

Assistant:

void DoHeaderLine()
    {
    if(this->RegexHeader.find(this->Line))
      {
      this->Rev.Rev = this->RegexHeader.match(1);
      this->Rev.Date = this->RegexHeader.match(4);

      cmCTestP4::User user = P4->GetUserData(this->RegexHeader.match(2));
      this->Rev.Author = user.Name;
      this->Rev.EMail = user.EMail;

      this->Rev.Committer = this->Rev.Author;
      this->Rev.CommitterEMail = this->Rev.EMail;
      this->Rev.CommitDate = this->Rev.Date;
      }
    }